

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  uint uVar2;
  ExprList *pEVar3;
  sqlite3 *db;
  Expr *pEVar4;
  bool bVar5;
  Select *pSVar6;
  Select *pSVar7;
  int iVar8;
  ulong uVar9;
  Expr *pEVar10;
  ExprList_item *pEVar11;
  long lVar12;
  Expr *pE;
  Expr *pEVar13;
  ulong uVar14;
  ExprList_item *pEVar15;
  Expr *p;
  int iVar16;
  int local_5c;
  Expr *local_58;
  Parse *local_50;
  ExprList_item *local_48;
  Token local_40;
  
  pEVar3 = pSelect->pOrderBy;
  if (pEVar3 == (ExprList *)0x0) {
    return 0;
  }
  db = pParse->db;
  uVar2 = pEVar3->nExpr;
  uVar9 = (ulong)uVar2;
  if (db->aLimit[2] < (int)uVar2) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar2) {
      lVar12 = 0;
      do {
        pbVar1 = &pEVar3->a[0].fg.field_0x1 + lVar12;
        *pbVar1 = *pbVar1 & 0xfb;
        lVar12 = lVar12 + 0x18;
      } while (uVar9 * 0x18 != lVar12);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar7 = pSelect->pPrior;
    while (pSVar6 = pSVar7, pSVar6 != (Select *)0x0) {
      pSVar6->pNext = pSelect;
      pSelect = pSVar6;
      pSVar7 = pSVar6->pPrior;
    }
    local_48 = pEVar3->a;
    do {
      if ((int)uVar9 < 1) {
        return 0;
      }
      local_50 = (Parse *)pSelect->pEList;
      iVar16 = 0;
      bVar5 = false;
      pEVar15 = local_48;
      do {
        local_5c = -1;
        if (((ulong)((anon_union_8_2_a01b6dbf_for_x *)&pEVar15->fg)->pList & 0x400) == 0) {
          p = pEVar15->pExpr;
          while (p != (Expr *)0x0) {
            if ((p->flags & 0x82000) == 0) {
LAB_00176980:
              iVar8 = sqlite3ExprIsInteger(p,&local_5c);
              if (iVar8 == 0) {
                iVar8 = resolveAsName(local_50,(ExprList *)p,pE);
                if (iVar8 == 0) {
                  iVar8 = 0;
                  pEVar10 = exprDup(db,p,0,(EdupBuf *)0x0);
                  if (((db->mallocFailed == '\0') &&
                      (local_58 = pEVar10,
                      iVar8 = resolveOrderByTermToExprList
                                        (pParse,(Select *)pSelect->pEList,(Expr *)pSelect->pSrc),
                      pEVar10 = local_58, 1 < pParse->eParseMode)) && (0 < iVar8)) {
                    resolveOrderByTermToExprList
                              (pParse,(Select *)pSelect->pEList,(Expr *)pSelect->pSrc);
                    pEVar10 = local_58;
                  }
                  if (pEVar10 != (Expr *)0x0) {
                    sqlite3ExprDeleteNN(db,pEVar10);
                  }
                }
                if (iVar8 < 1) {
                  bVar5 = true;
                  break;
                }
              }
              else if ((local_5c < 1) || (iVar8 = local_5c, *(int *)&local_50->db < local_5c)) {
                resolveOutOfRangeError(pParse,"ORDER",iVar16 + 1,*(int *)&local_50->db,p);
                return 1;
              }
              if (pParse->eParseMode < 2) {
                local_40.z = (char *)0x0;
                local_40.n = 0;
                pEVar10 = sqlite3ExprAlloc(db,0x9b,&local_40,0);
                if (pEVar10 == (Expr *)0x0) {
                  return 1;
                }
                pbVar1 = (byte *)((long)&pEVar10->flags + 1);
                *pbVar1 = *pbVar1 | 8;
                (pEVar10->u).iValue = iVar8;
                pEVar11 = pEVar15;
                pEVar4 = pEVar15->pExpr;
                if (pEVar15->pExpr != p) {
                  do {
                    pEVar13 = pEVar4;
                    pEVar4 = pEVar13->pLeft;
                  } while (pEVar4->op == 'q');
                  pEVar11 = (ExprList_item *)&pEVar13->pLeft;
                }
                pEVar11->pExpr = pEVar10;
                sqlite3ExprDeleteNN(db,p);
                (pEVar15->u).x.iOrderByCol = (u16)iVar8;
              }
              pbVar1 = (byte *)((long)&pEVar15->fg + 1);
              *pbVar1 = *pbVar1 | 4;
              break;
            }
            if ((p->flags >> 0x13 & 1) == 0) {
              if (p->op != 'q') goto LAB_00176980;
              pEVar11 = (ExprList_item *)&p->pLeft;
            }
            else {
              pEVar11 = ((p->x).pList)->a;
            }
            p = pEVar11->pExpr;
          }
        }
        iVar16 = iVar16 + 1;
        pEVar15 = pEVar15 + 1;
        uVar2 = pEVar3->nExpr;
        uVar9 = (ulong)uVar2;
      } while (iVar16 < (int)uVar2);
      pSelect = pSelect->pNext;
    } while ((pSelect != (Select *)0x0) && (bVar5));
    if ((int)uVar2 < 1) {
      return 0;
    }
    uVar14 = 1;
    lVar12 = 0;
    while (((&pEVar3->a[0].fg.field_0x1)[lVar12] & 4) != 0) {
      uVar14 = (ulong)((int)uVar14 + 1);
      lVar12 = lVar12 + 0x18;
      if (uVar9 * 0x18 == lVar12) {
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",uVar14);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].fg.done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->fg.done ) continue;
      pE = sqlite3ExprSkipCollateAndLikely(pItem->pExpr);
      if( NEVER(pE==0) ) continue;
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr, pE);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          /* Now test if expression pE matches one of the values returned
          ** by pSelect. In the usual case this is done by duplicating the
          ** expression, resolving any symbols in it, and then comparing
          ** it against each expression returned by the SELECT statement.
          ** Once the comparisons are finished, the duplicate expression
          ** is deleted.
          **
          ** If this is running as part of an ALTER TABLE operation and
          ** the symbols resolve successfully, also resolve the symbols in the
          ** actual expression. This allows the code in alter.c to modify
          ** column references within the ORDER BY expression as required.  */
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
            if( IN_RENAME_OBJECT && iCol>0 ){
              resolveOrderByTermToExprList(pParse, pSelect, pE);
            }
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists. */
        if( !IN_RENAME_OBJECT ){
          Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
          if( pNew==0 ) return 1;
          pNew->flags |= EP_IntValue;
          pNew->u.iValue = iCol;
          if( pItem->pExpr==pE ){
            pItem->pExpr = pNew;
          }else{
            Expr *pParent = pItem->pExpr;
            assert( pParent->op==TK_COLLATE );
            while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
            assert( pParent->pLeft==pE );
            pParent->pLeft = pNew;
          }
          sqlite3ExprDelete(db, pE);
          pItem->u.x.iOrderByCol = (u16)iCol;
        }
        pItem->fg.done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].fg.done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}